

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::
     AddDescriptorsImpl(void)

{
  _func_void *in_stack_00000008;
  
  InitDefaults();
  DescriptorPool::InternalAddGeneratedFile(AddDescriptorsImpl::descriptor,0x27e);
  MessageFactory::InternalRegisterGeneratedFile
            ("google/protobuf/compiler/plugin.proto",anon_unknown_5::protobuf_RegisterTypes);
  protobuf_google_2fprotobuf_2fdescriptor_2eproto::AddDescriptors();
  internal::OnShutdown(in_stack_00000008);
  return;
}

Assistant:

void AddDescriptorsImpl() {
  InitDefaults();
  static const char descriptor[] = {
      "\n%google/protobuf/compiler/plugin.proto\022"
      "\030google.protobuf.compiler\032 google/protob"
      "uf/descriptor.proto\"F\n\007Version\022\r\n\005major\030"
      "\001 \001(\005\022\r\n\005minor\030\002 \001(\005\022\r\n\005patch\030\003 \001(\005\022\016\n\006s"
      "uffix\030\004 \001(\t\"\272\001\n\024CodeGeneratorRequest\022\030\n\020"
      "file_to_generate\030\001 \003(\t\022\021\n\tparameter\030\002 \001("
      "\t\0228\n\nproto_file\030\017 \003(\0132$.google.protobuf."
      "FileDescriptorProto\022;\n\020compiler_version\030"
      "\003 \001(\0132!.google.protobuf.compiler.Version"
      "\"\252\001\n\025CodeGeneratorResponse\022\r\n\005error\030\001 \001("
      "\t\022B\n\004file\030\017 \003(\01324.google.protobuf.compil"
      "er.CodeGeneratorResponse.File\032>\n\004File\022\014\n"
      "\004name\030\001 \001(\t\022\027\n\017insertion_point\030\002 \001(\t\022\017\n\007"
      "content\030\017 \001(\tBg\n\034com.google.protobuf.com"
      "pilerB\014PluginProtosZ9github.com/golang/p"
      "rotobuf/protoc-gen-go/plugin;plugin_go"
  };
  ::google::protobuf::DescriptorPool::InternalAddGeneratedFile(
      descriptor, 638);
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(
    "google/protobuf/compiler/plugin.proto", &protobuf_RegisterTypes);
  ::google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::AddDescriptors();
  ::google::protobuf::internal::OnShutdown(&TableStruct::Shutdown);
}